

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::create_umac_grown(NavierStokesBase *this,int nGrow,MultiFab *a_divu)

{
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__x;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  MultiFab *pMVar5;
  bool bVar6;
  ostream *os_;
  NavierStokesBase *pNVar7;
  NavierStokesBase *pNVar8;
  _func_int ***ppp_Var9;
  MultiFab **ppMVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  Array<StateDataPhysBCFunct,_3> *physbcf;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  Geometry *pGVar19;
  ulong uVar21;
  long lVar22;
  MultiFab *pMVar23;
  double dVar24;
  _func_int **pp_Var25;
  Periodicity PVar26;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l;
  initializer_list<double> __l_00;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l_01;
  initializer_list<double> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<double> __l_04;
  int local_620;
  ulong local_610;
  NullInterpHook<amrex::FArrayBox> local_603;
  NullInterpHook<amrex::FArrayBox> local_602;
  allocator_type local_601;
  Geometry *local_600;
  MultiFab *local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  Real local_5c8;
  ulong local_5c0;
  int local_5b4;
  Array<MultiFab_*,_3> u_mac_fine;
  Array4<const_double> local_598;
  Array4<double> local_558;
  Array4<double> local_518;
  Array4<double> local_4d8;
  Array4<const_int> local_490;
  Box bx2;
  Box bx1;
  Box local_410;
  IntVect local_3f0;
  Box bx0;
  Array<int,_3> bf_idx;
  Array<int,_3> bc_idx;
  Array<Vector<BCRec>,_3> bcrecArr;
  MFIter mfi;
  Array<StateDataPhysBCFunct,_3> cbndyFuncArr;
  StateDataPhysBCFunct crse_bndry_func_z;
  StateDataPhysBCFunct crse_bndry_func_y;
  StateDataPhysBCFunct crse_bndry_func_x;
  iMultiFab mask;
  StateDataPhysBCFunct fine_bndry_func_z;
  StateDataPhysBCFunct fine_bndry_func_y;
  StateDataPhysBCFunct fine_bndry_func_x;
  Array<StateDataPhysBCFunct,_3> fbndyFuncArr;
  long lVar20;
  
  if (0 < nGrow) {
    if (nGrow != 1) {
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&mask,os_);
      std::operator<<((ostream *)
                      &mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                       m_bndryReg.m_typ,
                      "\n\nWARNING!\n  NSB::create_umac_grown currently only enforces the divergnece constraint on 1 ghost cell, but nGrow > 1\n\n"
                     );
      amrex::Print::~Print((Print *)&mask);
    }
    local_5c8 = (Real)CONCAT44(local_5c8._4_4_,nGrow);
    u_mac_fine._M_elems[0] = this->u_mac;
    u_mac_fine._M_elems[1] = u_mac_fine._M_elems[0] + 1;
    u_mac_fine._M_elems[2] = u_mac_fine._M_elems[0] + 2;
    pGVar19 = &(this->super_AmrLevel).geom;
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_x,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,0,pGVar19);
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_y,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,1,pGVar19);
    local_600 = pGVar19;
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_z,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,2,pGVar19);
    physbcf = &fbndyFuncArr;
    fbndyFuncArr._16_8_ = fine_bndry_func_x.geom;
    fbndyFuncArr._0_8_ = fine_bndry_func_x.statedata;
    fbndyFuncArr._8_4_ = fine_bndry_func_x.src_comp;
    fbndyFuncArr._12_4_ = fine_bndry_func_x._12_4_;
    fbndyFuncArr._24_8_ = fine_bndry_func_y.statedata;
    fbndyFuncArr._32_4_ = fine_bndry_func_y.src_comp;
    fbndyFuncArr._36_4_ = fine_bndry_func_y._12_4_;
    fbndyFuncArr._40_8_ = fine_bndry_func_y.geom;
    fbndyFuncArr._64_8_ = fine_bndry_func_z.geom;
    fbndyFuncArr._48_8_ = fine_bndry_func_z.statedata;
    fbndyFuncArr._56_4_ = fine_bndry_func_z.src_comp;
    fbndyFuncArr._60_4_ = fine_bndry_func_z._12_4_;
    iVar4 = (this->super_AmrLevel).level;
    if (iVar4 == 0) {
      ppMVar10 = u_mac_fine._M_elems;
      for (local_5f8 = (MultiFab *)0x0; local_5f8 != (MultiFab *)0x480;
          local_5f8 = (MultiFab *)((long)local_5f8 + 0x180)) {
        pMVar23 = (MultiFab *)
                  ((long)&(this->u_mac->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          _vptr_FabArrayBase + (long)local_5f8);
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = local_5c8._0_4_;
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = local_5c8._0_4_;
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = local_5c8._0_4_;
        cbndyFuncArr._0_8_ = *ppMVar10;
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&cbndyFuncArr;
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                  ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mask,__l_03,
                   (allocator_type *)&local_598);
        local_490.p = (int *)0x0;
        __l_04._M_len = 1;
        __l_04._M_array = (iterator)&local_490;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&mfi,__l_04,
                   (allocator_type *)&local_4d8);
        amrex::FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (pMVar23,(IntVect *)&bcrecArr,0.0,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mask,
                   (Vector<double,_std::allocator<double>_> *)&mfi,0,0,1,local_600,
                   (StateDataPhysBCFunct *)physbcf,0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&mfi);
        std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                  ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mask);
        ppMVar10 = ppMVar10 + 1;
        physbcf = (Array<StateDataPhysBCFunct,_3> *)&physbcf->field_0x18;
      }
    }
    else {
      pNVar7 = getLevel(this,iVar4 + -1);
      local_5f8 = pNVar7->u_mac;
      pNVar7 = getLevel(this,(this->super_AmrLevel).level + -1);
      pMVar23 = pNVar7->u_mac;
      pNVar7 = getLevel(this,(this->super_AmrLevel).level + -1);
      pMVar5 = pNVar7->u_mac;
      pNVar7 = getLevel(this,(this->super_AmrLevel).level + -1);
      __x = &this->m_bcrec_velocity;
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcrecArr,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                (&bcrecArr._M_elems[1].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                (&bcrecArr._M_elems[2].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      bc_idx._M_elems[0] = 0;
      bc_idx._M_elems[1] = 1;
      bc_idx._M_elems[2] = 2;
      pNVar8 = getLevel(this,(this->super_AmrLevel).level + -1);
      pGVar19 = &(pNVar7->super_AmrLevel).geom;
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_x,
                 (pNVar8->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,0,pGVar19);
      pNVar7 = getLevel(this,(this->super_AmrLevel).level + -1);
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_y,
                 (pNVar7->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,1,pGVar19);
      pNVar7 = getLevel(this,(this->super_AmrLevel).level + -1);
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_z,
                 (pNVar7->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,2,pGVar19);
      bf_idx._M_elems[2] = 0;
      bf_idx._M_elems[0] = 0;
      bf_idx._M_elems[1] = 0;
      cbndyFuncArr._16_8_ = crse_bndry_func_x.geom;
      cbndyFuncArr._0_8_ = crse_bndry_func_x.statedata;
      cbndyFuncArr._8_4_ = crse_bndry_func_x.src_comp;
      cbndyFuncArr._12_4_ = crse_bndry_func_x._12_4_;
      cbndyFuncArr._24_8_ = crse_bndry_func_y.statedata;
      cbndyFuncArr._32_4_ = crse_bndry_func_y.src_comp;
      cbndyFuncArr._36_4_ = crse_bndry_func_y._12_4_;
      cbndyFuncArr._40_8_ = crse_bndry_func_y.geom;
      cbndyFuncArr._48_8_ = crse_bndry_func_z.statedata;
      cbndyFuncArr._56_4_ = crse_bndry_func_z.src_comp;
      cbndyFuncArr._60_4_ = crse_bndry_func_z._12_4_;
      cbndyFuncArr._64_8_ = crse_bndry_func_z.geom;
      local_558.p._0_4_ = local_5c8._0_4_;
      local_558.p._4_4_ = local_5c8._0_4_;
      local_558.jstride._0_4_ = local_5c8._0_4_;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = SUB81(local_5f8,0);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
           (undefined7)((ulong)local_5f8 >> 8);
      __l._M_len = 1;
      __l._M_array = (iterator)&mfi;
      mfi.tile_size.vect._0_8_ = pMVar5 + 2;
      mfi.fabArray = (FabArrayBase *)(pMVar23 + 1);
      std::
      vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&mask,__l,(allocator_type *)&bx1);
      local_410.smallend.vect[0] = 0;
      local_410.smallend.vect[1] = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_410;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_490,__l_00,(allocator_type *)&bx2
                );
      local_4d8.kstride = (Long)u_mac_fine._M_elems[2];
      local_4d8.p = (double *)u_mac_fine._M_elems[0];
      local_4d8.jstride = (Long)u_mac_fine._M_elems[1];
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_4d8;
      std::
      vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&local_598,__l_01,(allocator_type *)&local_3f0);
      bx0.smallend.vect[0] = 0;
      bx0.smallend.vect[1] = 0;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&bx0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_518,__l_02,&local_601);
      amrex::
      FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                (&u_mac_fine,(IntVect *)&local_558,0.0,
                 (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  *)&mask,(Vector<double,_std::allocator<double>_> *)&local_490,
                 (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  *)&local_598,(Vector<double,_std::allocator<double>_> *)&local_518,0,0,1,pGVar19,
                 local_600,&cbndyFuncArr,&bf_idx,&fbndyFuncArr,&bf_idx,
                 &(this->super_AmrLevel).crse_ratio,(Interpolater *)&amrex::face_linear_interp,
                 &bcrecArr,&bc_idx,&local_602,&local_603);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_518);
      std::
      _Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                       *)&local_598);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_490);
      std::
      _Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                       *)&mask);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
      mfi.fabArray._0_4_ = 0;
      mfi.fabArray._4_4_ = 0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      local_490.p = (int *)&PTR__FabFactory_006d9518;
      amrex::iMultiFab::iMultiFab
                (&mask,&(this->super_AmrLevel).grids,
                 &(u_mac_fine._M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                  distributionMap,1,1,(MFInfo *)&mfi,(FabFactory<amrex::IArrayBox> *)&local_490);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      PVar26 = amrex::Geometry::periodicity(local_600);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
           (undefined1)PVar26.period.vect[0];
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
           PVar26.period.vect._1_7_;
      mfi.fabArray._0_4_ = PVar26.period.vect[2];
      amrex::FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                (&mask.super_FabArray<amrex::IArrayBox>,&(this->super_AmrLevel).geom.domain,
                 (Periodicity *)&mfi,0,1,0,0);
      dVar1 = (this->super_AmrLevel).geom.super_CoordSys.dx[0];
      dVar2 = (this->super_AmrLevel).geom.super_CoordSys.dx[1];
      dVar3 = (this->super_AmrLevel).geom.super_CoordSys.dx[2];
      local_5f8 = (MultiFab *)(this->super_AmrLevel).geom.super_CoordSys.inv_dx[0];
      local_600 = (Geometry *)(this->super_AmrLevel).geom.super_CoordSys.inv_dx[1];
      local_5c8 = (this->super_AmrLevel).geom.super_CoordSys.inv_dx[2];
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&mask,true);
      while( true ) {
        if (mfi.endIndex <= mfi.currentIndex) break;
        amrex::MFIter::tilebox(&local_410,&mfi);
        amrex::FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_490,&mask.super_FabArray<amrex::IArrayBox>,&mfi);
        if (a_divu == (MultiFab *)0x0) {
          local_598.kstride = 0;
          local_598.nstride = 0;
          local_598.p = (double *)0x0;
          local_598.jstride = 0;
          local_598.begin.x = 1;
          local_598.begin.y = 1;
          local_598.begin.z = 1;
          local_598.end.x = 0;
          local_598.end.y = 0;
          local_598.end.z = 0;
          local_598.ncomp = 0;
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_598,&a_divu->super_FabArray<amrex::FArrayBox>,&mfi);
        }
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_4d8,&u_mac_fine._M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_518,&u_mac_fine._M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_558,&u_mac_fine._M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
        bx1.smallend.vect[0] = 1;
        bx1.smallend.vect[1] = 0;
        bx1.smallend.vect[2] = 0;
        amrex::MFIter::growntilebox(&bx0,&mfi,&bx1.smallend);
        bx2.smallend.vect[0] = 0;
        bx2.smallend.vect[1] = 1;
        bx2.smallend.vect[2] = 0;
        amrex::MFIter::growntilebox(&bx1,&mfi,&bx2.smallend);
        local_3f0.vect[0] = 0;
        local_3f0.vect[1] = 0;
        local_3f0.vect[2] = 1;
        amrex::MFIter::growntilebox(&bx2,&mfi,&local_3f0);
        iVar18 = bx0.bigend.vect[1];
        iVar4 = bx0.bigend.vect[0];
        local_5d0 = (long)bx0.smallend.vect[0];
        local_5e8 = (long)bx0.smallend.vect[1];
        local_5e0 = CONCAT44(local_5e0._4_4_,bx0.bigend.vect[2]);
        local_5f0 = CONCAT44(local_5f0._4_4_,bx0.smallend.vect[1] + 1);
        local_5d8 = (long)bx0.smallend.vect[2];
        local_620 = bx0.smallend.vect[2];
        while( true ) {
          lVar13 = local_5d8;
          iVar12 = bx1.bigend.vect[0];
          local_620 = local_620 + 1;
          iVar14 = (int)lVar13;
          if ((int)local_5e0 < iVar14) break;
          local_5d8 = lVar13 + 1;
          lVar20 = local_5e8;
          iVar12 = (int)local_5f0;
          while (iVar15 = (int)lVar20, iVar15 <= iVar18) {
            for (lVar22 = local_5d0; iVar11 = (int)lVar22, iVar11 <= iVar4; lVar22 = lVar22 + 1) {
              bVar6 = amrex::Box::contains(&local_410,iVar11,iVar15,iVar14);
              if ((!bVar6) &&
                 (*(int *)((long)local_490.p +
                          lVar22 * 4 +
                          (lVar20 - local_490.begin.y) * local_490.jstride * 4 +
                          (lVar13 - local_490.begin.z) * local_490.kstride * 4 +
                          (long)local_490.begin.x * -4) == 1)) {
                if (local_598.p == (double *)0x0) {
                  dVar24 = 0.0;
                }
                else {
                  dVar24 = local_598.p
                           [((lVar13 - local_598.begin.z) * local_598.kstride +
                            (lVar20 - local_598.begin.y) * local_598.jstride + lVar22) -
                            (long)local_598.begin.x];
                }
                lVar17 = (lVar13 - local_518.begin.z) * local_518.kstride;
                lVar16 = (lVar20 - local_558.begin.y) *
                         CONCAT44(local_558.jstride._4_4_,(undefined4)local_558.jstride);
                dVar24 = (((*(double *)
                             ((long)local_518.p +
                             lVar22 * 8 +
                             (long)(iVar12 - local_518.begin.y) * local_518.jstride * 8 + lVar17 * 8
                             + (long)local_518.begin.x * -8) -
                           *(double *)
                            ((long)local_518.p +
                            lVar22 * 8 +
                            (lVar20 - local_518.begin.y) * local_518.jstride * 8 + lVar17 * 8 +
                            (long)local_518.begin.x * -8)) * (double)local_600 +
                          (*(double *)
                            ((long)(local_620 - local_558.begin.z) * local_558.kstride * 8 +
                             lVar16 * 8 + (long)local_558.begin.x * -8 +
                             CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8) -
                          *(double *)
                           ((lVar13 - local_558.begin.z) * local_558.kstride * 8 + lVar16 * 8 +
                            (long)local_558.begin.x * -8 +
                            CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8)) * local_5c8
                          ) - dVar24) * dVar1;
                if (iVar11 < local_410.smallend.vect[0]) {
                  iVar11 = iVar11 - local_4d8.begin.x;
                  lVar16 = ((long)iVar14 - (long)local_4d8.begin.z) * local_4d8.kstride;
                  ppp_Var9 = &(((FabArray<amrex::FArrayBox> *)local_4d8.p)->super_FabArrayBase).
                              _vptr_FabArrayBase +
                             ((long)iVar15 - (long)local_4d8.begin.y) * local_4d8.jstride;
                  pp_Var25 = (_func_int **)(dVar24 + (double)ppp_Var9[(iVar11 + 1) + lVar16]);
                }
                else {
                  if (iVar11 <= local_410.bigend.vect[0]) goto LAB_00234a0e;
                  lVar16 = ((long)iVar14 - (long)local_4d8.begin.z) * local_4d8.kstride;
                  ppp_Var9 = &(((FabArray<amrex::FArrayBox> *)local_4d8.p)->super_FabArrayBase).
                              _vptr_FabArrayBase +
                             ((long)iVar15 - (long)local_4d8.begin.y) * local_4d8.jstride;
                  pp_Var25 = (_func_int **)
                             (*(double *)
                               ((long)local_4d8.p +
                               lVar22 * 8 +
                               (lVar20 - local_4d8.begin.y) * local_4d8.jstride * 8 +
                               (lVar13 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                               (long)local_4d8.begin.x * -8) - dVar24);
                  iVar11 = (iVar11 - local_4d8.begin.x) + 1;
                }
                ppp_Var9[iVar11 + lVar16] = pp_Var25;
              }
LAB_00234a0e:
            }
            iVar12 = iVar12 + 1;
            lVar20 = lVar20 + 1;
          }
        }
        local_5d8 = (long)bx1.smallend.vect[0];
        local_5f0 = (long)bx1.smallend.vect[1];
        local_5d0 = CONCAT44(local_5d0._4_4_,bx1.bigend.vect[1]);
        local_5e8 = CONCAT44(local_5e8._4_4_,bx1.bigend.vect[2]);
        local_5c0 = CONCAT44(local_5c0._4_4_,bx1.smallend.vect[1] + 1);
        local_5e0 = (long)bx1.smallend.vect[2];
        iVar4 = bx1.smallend.vect[2];
        while( true ) {
          lVar13 = local_5e0;
          iVar18 = bx2.bigend.vect[0];
          iVar4 = iVar4 + 1;
          iVar14 = (int)lVar13;
          if ((int)local_5e8 < iVar14) break;
          local_5e0 = lVar13 + 1;
          local_610 = local_5c0 & 0xffffffff;
          lVar20 = local_5f0;
          while( true ) {
            iVar18 = (int)lVar20;
            if ((int)local_5d0 < iVar18) break;
            lVar22 = local_5d8;
            while( true ) {
              iVar15 = (int)lVar22;
              if (iVar12 < iVar15) break;
              bVar6 = amrex::Box::contains(&local_410,iVar15,iVar18,iVar14);
              if ((!bVar6) &&
                 (*(int *)((long)local_490.p +
                          lVar22 * 4 +
                          (lVar20 - local_490.begin.y) * local_490.jstride * 4 +
                          (lVar13 - local_490.begin.z) * local_490.kstride * 4 +
                          (long)local_490.begin.x * -4) == 1)) {
                if (local_598.p == (double *)0x0) {
                  dVar24 = 0.0;
                }
                else {
                  dVar24 = local_598.p
                           [((lVar13 - local_598.begin.z) * local_598.kstride +
                            (lVar20 - local_598.begin.y) * local_598.jstride + lVar22) -
                            (long)local_598.begin.x];
                }
                lVar16 = (lVar20 - local_558.begin.y) *
                         CONCAT44(local_558.jstride._4_4_,(undefined4)local_558.jstride);
                dVar24 = ((((double)(&(((FabArray<amrex::FArrayBox> *)local_4d8.p)->
                                      super_FabArrayBase)._vptr_FabArrayBase)
                                    [((long)iVar18 - (long)local_4d8.begin.y) * local_4d8.jstride +
                                     (long)((iVar15 - local_4d8.begin.x) + 1) +
                                     ((long)iVar14 - (long)local_4d8.begin.z) * local_4d8.kstride] -
                           *(double *)
                            ((long)local_4d8.p +
                            lVar22 * 8 +
                            (lVar20 - local_4d8.begin.y) * local_4d8.jstride * 8 +
                            (lVar13 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                            (long)local_4d8.begin.x * -8)) * (double)local_5f8 +
                          (*(double *)
                            ((long)(iVar4 - local_558.begin.z) * local_558.kstride * 8 + lVar16 * 8
                             + (long)local_558.begin.x * -8 +
                             CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8) -
                          *(double *)
                           ((lVar13 - local_558.begin.z) * local_558.kstride * 8 + lVar16 * 8 +
                            (long)local_558.begin.x * -8 +
                            CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8)) * local_5c8
                          ) - dVar24) * dVar2;
                if (iVar18 < local_410.smallend.vect[1]) {
                  lVar16 = lVar22 - local_518.begin.x;
                  dVar24 = dVar24 + local_518.p
                                    [((lVar13 - local_518.begin.z) * local_518.kstride +
                                     ((int)local_610 - local_518.begin.y) * local_518.jstride +
                                     lVar22) - (long)local_518.begin.x];
                  iVar15 = iVar18 - local_518.begin.y;
                }
                else {
                  if (iVar18 <= local_410.bigend.vect[1]) goto LAB_00234dcd;
                  lVar16 = (long)iVar15 - (long)local_518.begin.x;
                  dVar24 = local_518.p
                           [((lVar13 - local_518.begin.z) * local_518.kstride +
                            (lVar20 - local_518.begin.y) * local_518.jstride + lVar22) -
                            (long)local_518.begin.x] - dVar24;
                  iVar15 = (int)(lVar20 + 1) - local_518.begin.y;
                }
                local_518.p
                [iVar15 * local_518.jstride +
                 lVar16 + ((long)iVar14 - (long)local_518.begin.z) * local_518.kstride] = dVar24;
              }
LAB_00234dcd:
              lVar22 = lVar22 + 1;
            }
            local_610 = (ulong)((int)local_610 + 1);
            lVar20 = lVar20 + 1;
          }
        }
        local_5e0 = (long)bx2.smallend.vect[0];
        local_5c0 = (ulong)bx2.smallend.vect[1];
        local_5d8 = CONCAT44(local_5d8._4_4_,bx2.bigend.vect[1]);
        local_5f0 = CONCAT44(local_5f0._4_4_,bx2.bigend.vect[2]);
        local_5b4 = bx2.smallend.vect[1] + 1;
        local_5e8 = local_5e0 * 8;
        lVar13 = (long)bx2.smallend.vect[2];
        iVar4 = bx2.smallend.vect[2];
        while( true ) {
          lVar20 = lVar13;
          iVar4 = iVar4 + 1;
          iVar12 = (int)lVar20;
          if ((int)local_5f0 < iVar12) break;
          uVar21 = local_5c0;
          iVar14 = local_5b4;
          while( true ) {
            iVar15 = (int)uVar21;
            lVar13 = lVar20 + 1;
            if ((int)local_5d8 < iVar15) break;
            local_5d0 = uVar21 + 1;
            lVar13 = local_5e8;
            lVar22 = local_5e0;
            while( true ) {
              iVar11 = (int)lVar22;
              if (iVar18 < iVar11) break;
              bVar6 = amrex::Box::contains(&local_410,iVar11,iVar15,iVar12);
              if ((!bVar6) &&
                 (*(int *)((long)local_490.p +
                          lVar22 * 4 +
                          (uVar21 - (long)local_490.begin.y) * local_490.jstride * 4 +
                          (lVar20 - local_490.begin.z) * local_490.kstride * 4 +
                          (long)local_490.begin.x * -4) == 1)) {
                if (local_598.p == (double *)0x0) {
                  dVar24 = 0.0;
                }
                else {
                  dVar24 = local_598.p
                           [((lVar20 - local_598.begin.z) * local_598.kstride +
                            (uVar21 - (long)local_598.begin.y) * local_598.jstride + lVar22) -
                            (long)local_598.begin.x];
                }
                lVar16 = (lVar20 - local_518.begin.z) * local_518.kstride;
                dVar24 = (((*(double *)
                             ((long)local_518.p +
                             lVar22 * 8 +
                             (long)(iVar14 - local_518.begin.y) * local_518.jstride * 8 + lVar16 * 8
                             + (long)local_518.begin.x * -8) -
                           *(double *)
                            ((long)local_518.p +
                            lVar22 * 8 +
                            (uVar21 - (long)local_518.begin.y) * local_518.jstride * 8 + lVar16 * 8
                            + (long)local_518.begin.x * -8)) * (double)local_600 +
                          ((double)(&(((FabArray<amrex::FArrayBox> *)local_4d8.p)->
                                     super_FabArrayBase)._vptr_FabArrayBase)
                                   [((long)iVar15 - (long)local_4d8.begin.y) * local_4d8.jstride +
                                    (long)((iVar11 - local_4d8.begin.x) + 1) +
                                    ((long)iVar12 - (long)local_4d8.begin.z) * local_4d8.kstride] -
                          *(double *)
                           ((long)local_4d8.p +
                           lVar22 * 8 +
                           (uVar21 - (long)local_4d8.begin.y) * local_4d8.jstride * 8 +
                           (lVar20 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                           (long)local_4d8.begin.x * -8)) * (double)local_5f8) - dVar24) * dVar3;
                if (iVar12 < local_410.smallend.vect[2]) {
                  lVar17 = (uVar21 - (long)local_558.begin.y) *
                           CONCAT44(local_558.jstride._4_4_,(undefined4)local_558.jstride);
                  lVar16 = lVar17 * 8 + (long)local_558.begin.x * -8 +
                           CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar13;
                  dVar24 = dVar24 + *(double *)
                                     ((iVar4 - local_558.begin.z) * local_558.kstride * 8 +
                                      lVar17 * 8 + (long)local_558.begin.x * -8 +
                                      CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8);
                  iVar11 = iVar12 - local_558.begin.z;
                }
                else {
                  if (iVar12 <= local_410.bigend.vect[2]) goto LAB_002351ae;
                  lVar16 = CONCAT44(local_558.p._4_4_,local_558.p._0_4_) +
                           ((long)iVar15 - (long)local_558.begin.y) *
                           CONCAT44(local_558.jstride._4_4_,(undefined4)local_558.jstride) * 8 +
                           ((long)iVar11 - (long)local_558.begin.x) * 8;
                  dVar24 = *(double *)
                            ((uVar21 - (long)local_558.begin.y) *
                             CONCAT44(local_558.jstride._4_4_,(undefined4)local_558.jstride) * 8 +
                             (lVar20 - local_558.begin.z) * local_558.kstride * 8 +
                             (long)local_558.begin.x * -8 +
                             CONCAT44(local_558.p._4_4_,local_558.p._0_4_) + lVar22 * 8) - dVar24;
                  iVar11 = (int)(lVar20 + 1) - local_558.begin.z;
                }
                *(double *)(lVar16 + iVar11 * local_558.kstride * 8) = dVar24;
              }
LAB_002351ae:
              lVar22 = lVar22 + 1;
              lVar13 = lVar13 + 8;
            }
            iVar14 = iVar14 + 1;
            uVar21 = local_5d0;
          }
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
      amrex::iMultiFab::~iMultiFab(&mask);
      std::array<amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,_3UL>::~array(&bcrecArr)
      ;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::create_umac_grown (int nGrow,
                                     const MultiFab* a_divu)
{
    if ( nGrow <= 0 ) { return; }
    if ( nGrow > 1 )  { Print()<<"\n\nWARNING!\n  NSB::create_umac_grown currently only enforces the divergnece constraint on 1 ghost cell, but nGrow > 1\n\n"; }


    Array<MultiFab*, AMREX_SPACEDIM> u_mac_fine;
    AMREX_D_TERM(u_mac_fine[0] = &u_mac[0];,
                 u_mac_fine[1] = &u_mac[1];,
                 u_mac_fine[2] = &u_mac[2];);

    Geometry *fine_geom = &geom;

    //Grab the velocity phys bc fill function from the StateData StateDescriptor
    AMREX_D_TERM(StateDataPhysBCFunct fine_bndry_func_x(get_state_data(State_Type),0,geom);,
                 StateDataPhysBCFunct fine_bndry_func_y(get_state_data(State_Type),1,geom);,
                 StateDataPhysBCFunct fine_bndry_func_z(get_state_data(State_Type),2,geom););

    Array<StateDataPhysBCFunct,AMREX_SPACEDIM> fbndyFuncArr = {AMREX_D_DECL(fine_bndry_func_x,
									    fine_bndry_func_y,
									    fine_bndry_func_z)};


    if ( level == 0 )
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            //
            // BDS needs physical BCs filled.
            // Godunov needs periodic ghosts filled (and handles physical BCs internally).
            //
            Real fake_time = 0.;
            amrex::FillPatchSingleLevel(u_mac[idim], IntVect(nGrow), fake_time,
                                        {u_mac_fine[idim]}, {fake_time},
                                        0, 0, 1, geom,
                                        fbndyFuncArr[idim], 0);
        }
    }
    else // level > 0
    {
        Array<MultiFab*, AMREX_SPACEDIM> u_mac_crse;
        AMREX_D_TERM(u_mac_crse[0] = &getLevel(level-1).u_mac[0];,
                     u_mac_crse[1] = &getLevel(level-1).u_mac[1];,
                     u_mac_crse[2] = &getLevel(level-1).u_mac[2];);

        Geometry *crse_geom = &getLevel(level-1).geom;

        //
        // First interpolate, ignoring divergence constraint. Then correct
        // the 1-cell wide halo of ghosts cells we need to enforce the
        // constraint.
        //

        // Divergence preserving interp -- This is for case of MAC solve on
        // composite grid; doesn't make sense to use it here.
        //Interpolater* mapper = &face_divfree_interp;
        // Use linear interpolation, which matches up with old create umac grown
        Interpolater* mapper = &face_linear_interp;

        // This never actually gets used because the FaceLinear Interpolator doesn't use it.
        // Inside FillPatchTwoLevels, it's only use is that it's passed to the interpolator.
        // Fill it with the correct thing anyway.
        Array<Vector<BCRec>,AMREX_SPACEDIM> bcrecArr = {AMREX_D_DECL(m_bcrec_velocity,
                                                                     m_bcrec_velocity,
                                                                     m_bcrec_velocity)};
        Array<int, AMREX_SPACEDIM> bc_idx = {AMREX_D_DECL(0,1,2)};

        // Grab the velocity phys bc fill function from the StateData StateDescriptor
        // This will use the BCRec for velocity stored in the StateDescriptor
        AMREX_D_TERM(
            StateDataPhysBCFunct crse_bndry_func_x(getLevel(level-1).get_state_data(State_Type),0,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_y(getLevel(level-1).get_state_data(State_Type),1,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_z(getLevel(level-1).get_state_data(State_Type),2,*crse_geom););
        Array<int, AMREX_SPACEDIM> bf_idx = {AMREX_D_DECL(0,0,0)};

        Array<StateDataPhysBCFunct,AMREX_SPACEDIM> cbndyFuncArr = {AMREX_D_DECL(crse_bndry_func_x,
										crse_bndry_func_y,
										crse_bndry_func_z)};

        // Use piecewise constant interpolation in time, so create ficticious variable for time
        Real fake_time = 0.;

        FillPatchTwoLevels(u_mac_fine, IntVect(nGrow), fake_time,
                           {u_mac_crse}, {fake_time},
                           {u_mac_fine}, {fake_time},
                           0, 0, 1,
                           *crse_geom, *fine_geom,
                           cbndyFuncArr, bf_idx, fbndyFuncArr, bf_idx,
                           crse_ratio, mapper, bcrecArr, bc_idx);

        //
        // Correct u_mac to enforce the divergence constraint in the ghost cells.
        // Do this by adjusting only the outer face (wrt the valid region) of the ghost
        // cell, i.e. for the hi-x face, adjust umac_x(i+1).
        // NOTE that this does not fill edges or corners.
        //

        // Build mask to find the ghost cells we need to correct.
        // covered   : ghost cells covered by valid cells of this FabArray
        //             (including periodically shifted valid cells)
        // notcovered: ghost cells not covered by valid cells
        //             (including ghost cells outside periodic boundaries)
        // physbnd   : boundary cells outside the domain (excluding periodic boundaries)
        // interior  : interior cells (i.e., valid cells)
        int covered   = 0;
        int uncovered = 1;
        int physbnd   = 0;
        int interior  = 0;
        iMultiFab mask(grids, u_mac_fine[0]->DistributionMap(), 1, 1, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(fine_geom->Domain(), fine_geom->periodicity(),
                       covered, uncovered, physbnd, interior);

        const GpuArray<Real,AMREX_SPACEDIM> dx = fine_geom->CellSizeArray();
        const GpuArray<Real,AMREX_SPACEDIM> dxinv = fine_geom->InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& maskarr = mask.const_array(mfi);
            Array4<const Real> foo;
            auto const& divu = (a_divu) ? a_divu->const_array(mfi) : foo;
            AMREX_D_TERM(auto const& umac = u_mac_fine[0]->array(mfi);,
                         auto const& vmac = u_mac_fine[1]->array(mfi);,
                         auto const& wmac = u_mac_fine[2]->array(mfi));

            // Fuse the launches, 1 for each dimension, into a single launch.
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(RunOn::Gpu,
                mfi.growntilebox(IntVect::TheDimensionVector(0)), bx0,
                {
                    AMREX_LOOP_3D(bx0, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[0] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( i < bx.smallEnd(0) )
                            {
                                umac(i,j,k) = umac(i+1,j,k) + tmp;
                            }
                            else if ( i > bx.bigEnd(0) )
                            {
                                umac(i+1,j,k) = umac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(1)), bx1,
                {
                    AMREX_LOOP_3D(bx1, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[1] * (   dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( j < bx.smallEnd(1) )
                            {
                                vmac(i,j,k) = vmac(i,j+1,k) + tmp;
                            }
                            else if ( j > bx.bigEnd(1) )
                            {
                                vmac(i,j+1,k) = vmac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(2)), bx2,
                {
                    AMREX_LOOP_3D(bx2, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[2] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
                                             + dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
                                             - tmp );

                            if ( k < bx.smallEnd(2) )
                            {
                                wmac(i,j,k) = wmac(i,j,k+1) + tmp;
                            }
                            else if ( k > bx.bigEnd(2) )
                            {
                                wmac(i,j,k+1) = wmac(i,j,k) - tmp;
                            }
                        }
                    });
                });
        }
    }
}